

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O1

RemoteGraph * Omega_h::get_own_verts2own_elems(RemoteGraph *__return_storage_ptr__,Mesh *mesh)

{
  int *piVar1;
  Alloc *pAVar2;
  bool bVar3;
  Remotes local_uses2own_elems;
  Remotes serv_uses2own_elems;
  LOs own_verts2serv_uses;
  Dist local_uses2own_verts;
  Dist own_verts2local_uses;
  Remotes local_1a8;
  Remotes local_188;
  Remotes local_168;
  Alloc *local_148;
  void *local_140;
  Dist local_138;
  Dist local_a8;
  
  get_local_elem_uses2own_elems(&local_188,mesh);
  get_local_elem_uses2own_verts(&local_138,mesh);
  local_1a8.ranks.write_.shared_alloc_.alloc = local_188.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_188.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8.ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_188.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_188.ranks.write_.shared_alloc_.alloc)->use_count =
           (local_188.ranks.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1a8.ranks.write_.shared_alloc_.direct_ptr = local_188.ranks.write_.shared_alloc_.direct_ptr;
  local_1a8.idxs.write_.shared_alloc_.alloc = local_188.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_188.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8.idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_188.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_188.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_188.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1a8.idxs.write_.shared_alloc_.direct_ptr = local_188.idxs.write_.shared_alloc_.direct_ptr;
  Dist::exch(&local_168,&local_138,&local_1a8,1);
  pAVar2 = local_1a8.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_1a8.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1a8.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a8.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_1a8.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_1a8.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1a8.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a8.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  Dist::invert(&local_a8,&local_138);
  Dist::roots2items(&local_a8);
  (__return_storage_ptr__->locals2edges).write_.shared_alloc_.alloc = local_148;
  bVar3 = ((ulong)local_148 & 7) == 0;
  if (bVar3 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (__return_storage_ptr__->locals2edges).write_.shared_alloc_.alloc =
           (Alloc *)(local_148->size * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  (__return_storage_ptr__->locals2edges).write_.shared_alloc_.direct_ptr = local_140;
  (__return_storage_ptr__->edges2remotes).ranks.write_.shared_alloc_.alloc =
       local_168.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_168.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (__return_storage_ptr__->edges2remotes).ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_168.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_168.ranks.write_.shared_alloc_.alloc)->use_count =
           (local_168.ranks.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  (__return_storage_ptr__->edges2remotes).ranks.write_.shared_alloc_.direct_ptr =
       local_168.ranks.write_.shared_alloc_.direct_ptr;
  (__return_storage_ptr__->edges2remotes).idxs.write_.shared_alloc_.alloc =
       local_168.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_168.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (__return_storage_ptr__->edges2remotes).idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_168.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_168.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_168.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  (__return_storage_ptr__->edges2remotes).idxs.write_.shared_alloc_.direct_ptr =
       local_168.idxs.write_.shared_alloc_.direct_ptr;
  if (bVar3 && local_148 != (Alloc *)0x0) {
    piVar1 = &local_148->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148);
      operator_delete(local_148,0x48);
    }
  }
  Dist::~Dist(&local_a8);
  if (((ulong)local_168.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.idxs.write_.shared_alloc_.alloc);
      operator_delete(local_168.idxs.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_168.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.ranks.write_.shared_alloc_.alloc);
      operator_delete(local_168.ranks.write_.shared_alloc_.alloc,0x48);
    }
  }
  Dist::~Dist(&local_138);
  if (((ulong)local_188.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_188.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188.idxs.write_.shared_alloc_.alloc);
      operator_delete(local_188.idxs.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_188.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_188.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188.ranks.write_.shared_alloc_.alloc);
      operator_delete(local_188.ranks.write_.shared_alloc_.alloc,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static RemoteGraph get_own_verts2own_elems(Mesh* mesh) {
  auto local_uses2own_elems = get_local_elem_uses2own_elems(mesh);
  auto local_uses2own_verts = get_local_elem_uses2own_verts(mesh);
  auto serv_uses2own_elems = local_uses2own_verts.exch(local_uses2own_elems, 1);
  auto own_verts2local_uses = local_uses2own_verts.invert();
  auto own_verts2serv_uses = own_verts2local_uses.roots2items();
  return {own_verts2serv_uses, serv_uses2own_elems};
}